

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_FindEnumTypeByName_Test::TestBody
          (FileDescriptorTest_FindEnumTypeByName_Test *this)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  char *pcVar3;
  EnumDescriptor *pEVar4;
  char *in_R9;
  string local_248;
  AssertHelper local_228;
  Message local_220;
  string_view local_218;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d0;
  Message local_1c8;
  string_view local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_178;
  Message local_170;
  string_view local_168;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  string_view local_110;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  string_view local_b8;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Message local_88;
  string_view local_80;
  EnumDescriptor *local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  string_view local_38;
  EnumDescriptor *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FileDescriptorTest_FindEnumTypeByName_Test *this_local;
  
  pFVar1 = (this->super_FileDescriptorTest).foo_file_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"FooEnum");
  local_28 = FileDescriptor::FindEnumTypeByName(pFVar1,local_38);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_20,"foo_enum_","foo_file_->FindEnumTypeByName(\"FooEnum\")",
             &(this->super_FileDescriptorTest).foo_enum_,&local_28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,400,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pFVar1 = (this->super_FileDescriptorTest).bar_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"BarEnum");
  local_70 = FileDescriptor::FindEnumTypeByName(pFVar1,local_80);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_68,"bar_enum_","bar_file_->FindEnumTypeByName(\"BarEnum\")",
             &(this->super_FileDescriptorTest).bar_enum_,&local_70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x191,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  pFVar1 = (this->super_FileDescriptorTest).foo_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"BarEnum");
  pEVar4 = FileDescriptor::FindEnumTypeByName(pFVar1,local_b8);
  local_a1 = pEVar4 == (EnumDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_a0,
               (AssertionResult *)"foo_file_->FindEnumTypeByName(\"BarEnum\") == nullptr","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  pFVar1 = (this->super_FileDescriptorTest).bar_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"FooEnum");
  pEVar4 = FileDescriptor::FindEnumTypeByName(pFVar1,local_110);
  local_f9 = pEVar4 == (EnumDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_f8,
               (AssertionResult *)"bar_file_->FindEnumTypeByName(\"FooEnum\") == nullptr","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pFVar1 = (this->super_FileDescriptorTest).baz_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"FooEnum");
  pEVar4 = FileDescriptor::FindEnumTypeByName(pFVar1,local_168);
  local_151 = pEVar4 == (EnumDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_150,
               (AssertionResult *)"baz_file_->FindEnumTypeByName(\"FooEnum\") == nullptr","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x195,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  pFVar1 = (this->super_FileDescriptorTest).foo_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"NoSuchEnum");
  pEVar4 = FileDescriptor::FindEnumTypeByName(pFVar1,local_1c0);
  local_1a9 = pEVar4 == (EnumDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1a8,
               (AssertionResult *)"foo_file_->FindEnumTypeByName(\"NoSuchEnum\") == nullptr","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x197,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  pFVar1 = (this->super_FileDescriptorTest).foo_file_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_218,"FooMessage");
  pEVar4 = FileDescriptor::FindEnumTypeByName(pFVar1,local_218);
  local_201 = pEVar4 == (EnumDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)local_200,
               (AssertionResult *)"foo_file_->FindEnumTypeByName(\"FooMessage\") == nullptr","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x198,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, FindEnumTypeByName) {
  EXPECT_EQ(foo_enum_, foo_file_->FindEnumTypeByName("FooEnum"));
  EXPECT_EQ(bar_enum_, bar_file_->FindEnumTypeByName("BarEnum"));

  EXPECT_TRUE(foo_file_->FindEnumTypeByName("BarEnum") == nullptr);
  EXPECT_TRUE(bar_file_->FindEnumTypeByName("FooEnum") == nullptr);
  EXPECT_TRUE(baz_file_->FindEnumTypeByName("FooEnum") == nullptr);

  EXPECT_TRUE(foo_file_->FindEnumTypeByName("NoSuchEnum") == nullptr);
  EXPECT_TRUE(foo_file_->FindEnumTypeByName("FooMessage") == nullptr);
}